

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O2

void __thiscall Args::Command::process(Command *this,Context *ctx)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  CmdLine *in_R8;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this->m_isDefined = true;
  iVar1 = *(int *)&(this->super_GroupIface).field_0x4c;
  if (iVar1 == 1) {
    std::__cxx11::string::string((string *)&local_b0,"Command \"",&local_b1);
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_30,this);
    std::operator+(&local_90,&local_b0,&local_30);
    std::operator+(&local_70,&local_90,"\" requires value that wasn\'t presented.");
    eatOneValue<Args::CmdLine,Args::Context>
              (&local_50,(Args *)ctx,(Context *)&local_70,
               (String *)(this->super_GroupIface).super_ArgIface.m_cmdLine,in_R8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_values,
               &local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_30);
    this_00 = &local_b0;
  }
  else {
    if (iVar1 != 2) {
      return;
    }
    std::__cxx11::string::string((string *)&local_90,"Command \"",(allocator *)&local_30);
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_b0,this);
    std::operator+(&local_70,&local_90,&local_b0);
    std::operator+(&local_50,&local_70,"\" requires value that wasn\'t presented.");
    eatValues<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,Args::CmdLine,Args::Context>
              (ctx,&this->m_values,&local_50,(this->super_GroupIface).super_ArgIface.m_cmdLine);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    this_00 = &local_90;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void process(
		//! Context of the command line.
		Context & ctx ) override
	{
		m_isDefined = true;

		switch( m_opt )
		{
			case ValueOptions::ManyValues :
			{
				eatValues( ctx, m_values,
					String( SL( "Command \"" ) ) +
						name() + SL( "\" requires value that wasn't presented." ),
					cmdLine() );
			}
				break;

			case ValueOptions::OneValue :
			{
				m_values.push_back( eatOneValue( ctx,
					String( SL( "Command \"" ) ) + name() +
						SL( "\" requires value that wasn't presented." ),
					cmdLine() ) );
			}
				break;

			default :
				break;
		}
	}